

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O3

bool __thiscall Code::checkExtremalVertex(Code *this,int vertexIndex,string *direction)

{
  int *piVar1;
  bool bVar2;
  undefined8 in_RAX;
  mapped_type *pmVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  int *piVar5;
  pointer pvVar6;
  int edgeIndex;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
           ::operator[](&this->upEdgesMap,direction);
  pvVar6 = (this->vertexToEdges).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar5 = pvVar6[vertexIndex].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = *(pointer *)
            ((long)&pvVar6[vertexIndex].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data + 8);
  if (piVar5 == piVar1) {
LAB_0010ec12:
    bVar2 = false;
  }
  else {
    pvVar6 = (pmVar3->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + vertexIndex;
    bVar2 = false;
    do {
      uStack_38 = CONCAT44(*piVar5,(undefined4)uStack_38);
      if ((this->syndrome).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start[*piVar5] == '\x01') {
        _Var4 = std::
                __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          ((pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start,
                           *(pointer *)
                            ((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data + 8),(long)&uStack_38 + 4);
        bVar2 = true;
        if (_Var4._M_current ==
            *(pointer *)
             ((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data + 8)) goto LAB_0010ec12;
      }
      piVar5 = piVar5 + 1;
    } while (piVar5 != piVar1);
  }
  return bVar2;
}

Assistant:

bool Code::checkExtremalVertex(const int vertexIndex, const std::string &direction)
{
    auto &upEdges = upEdgesMap[direction][vertexIndex];
    auto &edges = vertexToEdges[vertexIndex];
    bool edgeInSyndrome = false;
    for (const int edgeIndex : edges)
    {
        if (syndrome[edgeIndex] == 1)
        {
            edgeInSyndrome = true;
            if (std::find(upEdges.begin(), upEdges.end(), edgeIndex) == upEdges.end())
            {
                // Edge in syndrome is not an up-edge => vertex is not extremal
                return false;
            }
        }
    }
    return edgeInSyndrome;
}